

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfFlushMappedNamedBufferRange
          (ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  undefined4 *puVar7;
  GLuint local_38;
  GLuint not_a_buffer_name;
  undefined4 local_24;
  GLuint local_20;
  GLubyte dummy_data [4];
  GLuint buffer;
  bool internal_error;
  bool is_ok;
  Functions *gl;
  ErrorsTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  dummy_data[3] = '\x01';
  dummy_data[2] = '\0';
  local_20 = 0;
  local_24 = 0;
  (**(code **)(lVar6 + 0x3b8))(1,&local_20);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd6e);
  (*this->m_pNamedBufferStorage)(local_20,4,&local_24,0x42);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd71);
  local_38 = 0;
  do {
    local_38 = local_38 + 1;
    cVar1 = (**(code **)(lVar6 + 0xc68))();
  } while (cVar1 != '\0');
  (*this->m_pFlushMappedNamedBufferRange)(local_38,0,1);
  bVar2 = ErrorCheckAndLog(this,"glFlushMappedNamedBufferRange",0x502,
                           " if buffer is not the name of an existing buffer object.");
  dummy_data[3] = bVar2 & dummy_data[3];
  (*this->m_pMapNamedBufferRange)(local_20,0,4,0x12);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd86);
  (*this->m_pFlushMappedNamedBufferRange)(local_20,-1,1);
  bVar2 = ErrorCheckAndLog(this,"glFlushMappedNamedBufferRange",0x501," if offset is negative.");
  dummy_data[3] = bVar2 & dummy_data[3];
  (*this->m_pUnmapNamedBuffer)(local_20);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd8d);
  (*this->m_pMapNamedBufferRange)(local_20,0,4,0x12);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd94);
  (*this->m_pFlushMappedNamedBufferRange)(local_20,0,-1);
  bVar2 = ErrorCheckAndLog(this,"glFlushMappedNamedBufferRange",0x501," if length is negative.");
  dummy_data[3] = bVar2 & dummy_data[3];
  (*this->m_pUnmapNamedBuffer)(local_20);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd9b);
  (*this->m_pMapNamedBufferRange)(local_20,0,2,0x12);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xda2);
  (*this->m_pFlushMappedNamedBufferRange)(local_20,0,4);
  bVar2 = ErrorCheckAndLog(this,"glFlushMappedNamedBufferRange",0x501,
                           " if length exceeds the size of the mapping.");
  dummy_data[3] = bVar2 & dummy_data[3];
  (*this->m_pUnmapNamedBuffer)(local_20);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xdaa);
  (*this->m_pMapNamedBufferRange)(local_20,0,4,0x12);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xdb1);
  (*this->m_pFlushMappedNamedBufferRange)(local_20,1,4);
  bVar2 = ErrorCheckAndLog(this,"glFlushMappedNamedBufferRange",0x501,
                           " if offset + length exceeds the size of the mapping.");
  dummy_data[3] = bVar2 & dummy_data[3];
  (*this->m_pUnmapNamedBuffer)(local_20);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xdb9);
  (*this->m_pFlushMappedNamedBufferRange)(local_20,0,4);
  bVar2 = ErrorCheckAndLog(this,"glFlushMappedNamedBufferRange",0x502,
                           " if the buffer object is not mapped.");
  dummy_data[3] = bVar2 & dummy_data[3];
  (*this->m_pMapNamedBufferRange)(local_20,0,4,2);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xdc7);
  (*this->m_pFlushMappedNamedBufferRange)(local_20,0,4);
  bVar2 = ErrorCheckAndLog(this,"glFlushMappedNamedBufferRange",0x502,
                           " if the buffer is mapped without the MAP_FLUSH_EXPLICIT_BIT flag.");
  dummy_data[3] = bVar2 & dummy_data[3];
  (*this->m_pUnmapNamedBuffer)(local_20);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xdcf);
  if (local_20 != 0) {
    (**(code **)(lVar6 + 0x438))(1,&local_20);
    local_20 = 0;
  }
  if ((dummy_data[2] & 1) == 0) {
    return (bool)(dummy_data[3] & 1);
  }
  puVar7 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar7 = 0;
  __cxa_throw(puVar7,&int::typeinfo,0);
}

Assistant:

bool ErrorsTest::TestErrorsOfFlushMappedNamedBufferRange()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint  buffer		   = 0;
	glw::GLubyte dummy_data[4] = {};

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer, sizeof(dummy_data), &dummy_data, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name flush error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pFlushMappedNamedBufferRange(not_a_buffer_name, 0, 1);

			is_ok &= ErrorCheckAndLog("glFlushMappedNamedBufferRange", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test negative offset flush error behavior. */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pFlushMappedNamedBufferRange(buffer, -1, 1);

			is_ok &= ErrorCheckAndLog("glFlushMappedNamedBufferRange", GL_INVALID_VALUE, " if offset is negative.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test negative length flush error behavior. */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pFlushMappedNamedBufferRange(buffer, 0, -1);

			is_ok &= ErrorCheckAndLog("glFlushMappedNamedBufferRange", GL_INVALID_VALUE, " if length is negative.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test length exceeds the mapping size flush error behavior. */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data) / 2, GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pFlushMappedNamedBufferRange(buffer, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glFlushMappedNamedBufferRange", GL_INVALID_VALUE,
									  " if length exceeds the size of the mapping.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test offset + length exceeds the mapping size flush error behavior. */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pFlushMappedNamedBufferRange(buffer, 1, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glFlushMappedNamedBufferRange", GL_INVALID_VALUE,
									  " if offset + length exceeds the size of the mapping.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test not mapped buffer flush error behavior. */
		{
			m_pFlushMappedNamedBufferRange(buffer, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glFlushMappedNamedBufferRange", GL_INVALID_OPERATION,
									  " if the buffer object is not mapped.");
		}

		/* Test buffer flush without the MAP_FLUSH_EXPLICIT_BIT error behavior. */
		{
			(void)(glw::GLbyte*) m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_WRITE_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pFlushMappedNamedBufferRange(buffer, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glFlushMappedNamedBufferRange", GL_INVALID_OPERATION,
									  " if the buffer is mapped without the MAP_FLUSH_EXPLICIT_BIT flag.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}